

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O3

void __thiscall TEST_TestHarness_c_macros_Test::testBody(TEST_TestHarness_c_macros_Test *this)

{
  MemoryLeakDetector *this_00;
  size_t sVar1;
  void *buffer;
  void *pvVar2;
  UtestShell *pUVar3;
  size_t sVar4;
  TestTerminator *pTVar5;
  
  this_00 = MemoryLeakWarningPlugin::getGlobalDetector();
  sVar1 = MemoryLeakDetector::totalMemoryLeaks(this_00,mem_leak_period_checking);
  buffer = cpputest_malloc_location
                     (10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestHarness_cTest.cpp"
                      ,0x330);
  pvVar2 = cpputest_calloc_location
                     (10,0x14,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestHarness_cTest.cpp"
                      ,0x331);
  pvVar2 = cpputest_realloc_location
                     (pvVar2,100,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestHarness_cTest.cpp"
                      ,0x332);
  pUVar3 = UtestShell::getCurrent();
  sVar4 = MemoryLeakDetector::totalMemoryLeaks(this_00,mem_leak_period_checking);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,sVar1 + 2,sVar4,
             "LONGS_EQUAL(memLeaks + 2, memLeakDetector->totalMemoryLeaks(mem_leak_period_checking)) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestHarness_cTest.cpp"
             ,0x334,pTVar5);
  cpputest_free_location
            (buffer,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestHarness_cTest.cpp"
             ,0x336);
  cpputest_free_location
            (pvVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestHarness_cTest.cpp"
             ,0x337);
  pUVar3 = UtestShell::getCurrent();
  sVar4 = MemoryLeakDetector::totalMemoryLeaks(this_00,mem_leak_period_checking);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,sVar1,sVar4,
             "LONGS_EQUAL(memLeaks, memLeakDetector->totalMemoryLeaks(mem_leak_period_checking)) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestHarness_cTest.cpp"
             ,0x339,pTVar5);
  return;
}

Assistant:

TEST(TestHarness_c, macros)
{
#if CPPUTEST_USE_MALLOC_MACROS
    MemoryLeakDetector* memLeakDetector = MemoryLeakWarningPlugin::getGlobalDetector();
    size_t memLeaks = memLeakDetector->totalMemoryLeaks(mem_leak_period_checking);
#endif
    void* mem1 = malloc(10);
    void* mem2 = calloc(10, 20);
    void* mem3 = realloc(mem2, 100);
#if CPPUTEST_USE_MALLOC_MACROS
    LONGS_EQUAL(memLeaks + 2, memLeakDetector->totalMemoryLeaks(mem_leak_period_checking));
#endif
    free(mem1);
    free(mem3);
#if CPPUTEST_USE_MALLOC_MACROS
    LONGS_EQUAL(memLeaks, memLeakDetector->totalMemoryLeaks(mem_leak_period_checking));
#endif

}